

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O0

utf8_char_t *
caption_frame_read_char(caption_frame_t *frame,int row,int col,eia608_style_t *style,int *underline)

{
  caption_frame_cell_t *pcVar1;
  uint *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint *in_R8;
  caption_frame_cell_t *cell;
  utf8_char_t *local_8;
  
  pcVar1 = frame_buffer_cell((caption_frame_buffer_t *)(in_RDI + 0x40),in_ESI,in_EDX);
  if (pcVar1 == (caption_frame_cell_t *)0x0) {
    if (in_RCX != (uint *)0x0) {
      *in_RCX = 0;
    }
    if (in_R8 != (uint *)0x0) {
      *in_R8 = 0;
    }
    local_8 = "";
  }
  else {
    if (in_RCX != (uint *)0x0) {
      *in_RCX = (uint)(*(byte *)pcVar1 >> 1 & 7);
    }
    if (in_R8 != (uint *)0x0) {
      *in_R8 = (uint)(*(byte *)pcVar1 & 1);
    }
    local_8 = pcVar1->data;
  }
  return local_8;
}

Assistant:

const utf8_char_t* caption_frame_read_char(caption_frame_t* frame, int row, int col, eia608_style_t* style, int* underline)
{
    // always read from front
    caption_frame_cell_t* cell = frame_buffer_cell(&frame->front, row, col);

    if (!cell) {
        if (style) {
            (*style) = eia608_style_white;
        }

        if (underline) {
            (*underline) = 0;
        }

        return EIA608_CHAR_NULL;
    }

    if (style) {
        (*style) = cell->sty;
    }

    if (underline) {
        (*underline) = cell->uln;
    }

    return &cell->data[0];
}